

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

void __thiscall
ON_MeshSeparateNgonInfo::ON_MeshSeparateNgonInfo
          (ON_MeshSeparateNgonInfo *this,ON_Mesh *mesh,uint **vertex_face_map)

{
  uint uVar1;
  uint uVar2;
  uint **ppuVar3;
  uint *local_88;
  uint local_54;
  uint local_44;
  uint **vertex_face_map_local;
  ON_Mesh *mesh_local;
  ON_MeshSeparateNgonInfo *this_local;
  
  this->m_mesh = mesh;
  this->m_vertex_face_map = vertex_face_map;
  this->m_ngondex_from_facedex_map = (uint *)0x0;
  this->m_ngon_vmap = (uint *)0x0;
  if (mesh == (ON_Mesh *)0x0) {
    local_44 = 0;
  }
  else {
    local_44 = ON_Mesh::FaceUnsignedCount(mesh);
  }
  this->m_face_count = local_44;
  if (mesh == (ON_Mesh *)0x0) {
    local_54 = 0;
  }
  else {
    local_54 = ON_Mesh::VertexUnsignedCount(mesh);
  }
  this->m_vertex_count0 = local_54;
  this->m_vertex_count1 = this->m_vertex_count0;
  this->m_vertex_count2 = this->m_vertex_count0;
  this->m_ni = 0xffffffff;
  this->m_fi = 0xffffffff;
  this->m_vi = 0xffffffff;
  this->m_ngon_vmark = 0;
  this->m_ngon = (ON_MeshNgon *)0x0;
  ON_SimpleArray<unsigned_int>::ON_SimpleArray(&this->m_ngon_vmap_buffer);
  ON_MeshVertexFaceMap::ON_MeshVertexFaceMap(&this->m_local_vfmap);
  ON_FixedSizePool::ON_FixedSizePool(&this->m_virefpool);
  if (mesh != (ON_Mesh *)0x0) {
    uVar1 = this->m_face_count;
    uVar2 = ON_SimpleArray<unsigned_int>::UnsignedCount(&mesh->m_NgonMap);
    if (uVar1 == uVar2) {
      local_88 = ON_Mesh::NgonMap(mesh);
    }
    else {
      local_88 = ON_Mesh::CreateNgonMap(mesh);
    }
    this->m_ngondex_from_facedex_map = local_88;
    if (this->m_vertex_face_map == (uint **)0x0) {
      ON_MeshVertexFaceMap::SetFromMesh(&this->m_local_vfmap,mesh,true);
      ppuVar3 = ON_MeshVertexFaceMap::VertexFaceMap(&this->m_local_vfmap);
      this->m_vertex_face_map = ppuVar3;
    }
  }
  return;
}

Assistant:

ON_MeshSeparateNgonInfo(
    ON_Mesh* mesh,
    unsigned int** vertex_face_map
    )
    : m_mesh(mesh)
    , m_vertex_face_map(vertex_face_map)
    , m_face_count(mesh ? mesh->FaceUnsignedCount() : 0)
    , m_vertex_count0(mesh ? mesh->VertexUnsignedCount() : 0)
    , m_vertex_count1(m_vertex_count0)
    , m_vertex_count2(m_vertex_count0)
  {
    if ( 0 != mesh )
    {
      m_ngondex_from_facedex_map = ( m_face_count != mesh->m_NgonMap.UnsignedCount() )
        ? mesh->CreateNgonMap()
        : mesh->NgonMap();
    
      if ( 0 == m_vertex_face_map )
      {
        m_local_vfmap.SetFromMesh(mesh,true);
        m_vertex_face_map = const_cast<unsigned int**>(m_local_vfmap.VertexFaceMap());
      }
    }
  }